

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerWithAttr::SetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  ObjectSlotAttributes OVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  PropertyIndex index;
  PropertyIndex PVar5;
  BOOL BVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  Var aValue;
  PathTypeHandlerWithAttr *pPVar11;
  PropertyRecord *pPVar12;
  undefined4 in_register_00000084;
  PropertyValueInfo *pPVar13;
  RecyclableObject *local_50;
  RecyclableObject *func;
  PropertyValueInfo *local_40;
  uint local_38;
  ObjectSlotAttributes local_31 [8];
  PropertyAttributes attributes;
  
  func = (RecyclableObject *)CONCAT44(in_register_00000084,flags);
  local_40 = info;
  local_38 = propertyId;
  index = PathTypeHandlerBase::GetPropertyIndex((PathTypeHandlerBase *)this,propertyId);
  if (index != 0xffff) {
    OVar1 = (this->attributes).ptr[index];
    if ((OVar1 & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) {
      aValue = DynamicObject::GetSlot(instance,(uint)(this->setters).ptr[index]);
      local_50 = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(local_50,instance,value,(ScriptContext *)0x0);
      pPVar11 = (PathTypeHandlerWithAttr *)DynamicObject::GetTypeHandler(instance);
      uVar9 = local_38;
      if (pPVar11 == this) {
        if ((((this->attributes).ptr[index] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) &&
           (index = PathTypeHandlerBase::GetPropertyIndex((PathTypeHandlerBase *)this,local_38),
           ((this->attributes).ptr[index] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None)) {
          return 1;
        }
        pPVar13 = local_40;
        PVar5 = PathTypeHandlerBase::GetPropertyIndex((PathTypeHandlerBase *)this,local_38);
        if (index != PVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xf2a,
                                      "(index == PathTypeHandlerBase::GetPropertyIndex(propertyId))"
                                      ,"index == PathTypeHandlerBase::GetPropertyIndex(propertyId)")
          ;
          if (!bVar4) goto LAB_00c4f163;
          *puVar10 = 0;
        }
        local_31[0] = (this->attributes).ptr[index];
        if ((local_31[0] & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) {
          if (pPVar13 == (PropertyValueInfo *)0x0) {
            return 1;
          }
          bVar2 = (this->setters).ptr[index];
          pPVar13->m_instance = &instance->super_RecyclableObject;
          pPVar13->m_propertyIndex = (ushort)bVar2;
          pPVar13->m_attributes = local_31[0] & ObjectSlotAttr_PropertyAttributesMask;
          pPVar13->flags = InlineCacheSetterFlag;
          return 1;
        }
        if (pPVar13 == (PropertyValueInfo *)0x0) {
          return 1;
        }
        local_31[0] = local_31[0] & ObjectSlotAttr_PropertyAttributesMask;
        pPVar13->m_instance = &instance->super_RecyclableObject;
        pPVar13->m_propertyIndex = index;
      }
      else {
        pPVar12 = ScriptContext::GetPropertyName
                            ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).
                              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,local_38);
        uVar7 = (*(pPVar11->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(pPVar11,pPVar12);
        if ((PropertyIndex)uVar7 == 0xffff) {
          return 1;
        }
        iVar8 = (*(pPVar11->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x3c])
                          (pPVar11,instance,(ulong)uVar9,(ulong)(uVar7 & 0xffff),local_31);
        pPVar13 = local_40;
        if (iVar8 == 0) {
          return 1;
        }
        if ((local_31[0] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
          return 1;
        }
        uVar9 = (*(pPVar11->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x1a])
                          (pPVar11,instance,(ulong)uVar9,&local_50,local_40,
                           (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                           ->super_JavascriptLibraryBase).scriptContext.ptr);
        if (pPVar13 == (PropertyValueInfo *)0x0) {
          return 1;
        }
        if ((uVar9 & 2) == 0) {
          return 1;
        }
        pPVar13->m_instance = &instance->super_RecyclableObject;
        pPVar13->m_propertyIndex = (PropertyIndex)uVar7;
      }
      pPVar13->m_attributes = local_31[0];
      pPVar13->flags = InlineCacheNoFlags;
      return 1;
    }
    if ((OVar1 & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xf50,"(0)","Re-add of deleted property NYI in PathTypeHandler");
      if (!bVar4) {
LAB_00c4f163:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
  }
  BVar6 = PathTypeHandlerBase::SetPropertyInternal<false>
                    ((PathTypeHandlerBase *)this,instance,local_38,index,value,
                     ObjectSlotAttr_Default,local_40,(PropertyOperationFlags)func,SideEffects_Any,
                     false);
  return BVar6;
}

Assistant:

BOOL PathTypeHandlerWithAttr::SetProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyIndex index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            if (attributes[index] & ObjectSlotAttr_Accessor)
            {
                Assert(setters[index] != Constants::NoSlot);
                RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(setters[index]));
                JavascriptOperators::CallSetter(func, instance, value, NULL);

                // Wait for the setter to return before setting up the inline cache info, as the setter may change
                // the attributes
                DynamicTypeHandler *typeHandler = instance->GetTypeHandler();
                if (typeHandler == this)
                {
                    // Common path: setter didn't change the handler. Do the rest without virtual calls.
                    if (attributes[index] & ObjectSlotAttr_Deleted)
                    {
                        // Delete and re-add may have changed the index.
                        index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
                        if (attributes[index] & ObjectSlotAttr_Deleted)
                        {
                            // Current state is really "deleted". Don't cache.
                            return TRUE;
                        }
                    }
                    Assert(index == PathTypeHandlerBase::GetPropertyIndex(propertyId));

                    if (attributes[index] & ObjectSlotAttr_Accessor)
                    {
                        PropertyValueInfo::Set(info, instance, setters[index], ObjectSlotAttributesToPropertyAttributes(attributes[index]), InlineCacheSetterFlag);
                    }
                    else
                    {
                        PropertyValueInfo::Set(info, instance, index, ObjectSlotAttributesToPropertyAttributes(attributes[index]), InlineCacheNoFlags);
                    }
                }
                else
                {
                    PropertyAttributes attributes;
                    index = typeHandler->GetPropertyIndex(instance->GetScriptContext()->GetPropertyName(propertyId));
                    if (index == Constants::NoSlot)
                    {
                        return TRUE;
                    }
                    if (typeHandler->GetAttributesWithPropertyIndex(instance, propertyId, index, &attributes) == FALSE)
                    {
                        return TRUE;
                    }
                    if (attributes & PropertyDeleted)
                    {
                        return TRUE;
                    }
                    DescriptorFlags descriptorFlags = typeHandler->GetSetter(instance, propertyId, (Var*)&func, info, instance->GetScriptContext());
                    if (descriptorFlags & Data)
                    {
                        PropertyValueInfo::Set(info, instance, index, attributes, InlineCacheNoFlags);
                    }
                }

                return TRUE;
            }
            else if (attributes[index] & ObjectSlotAttr_Deleted)
            {
                AssertMsg(0, "Re-add of deleted property NYI in PathTypeHandler");
            }
        }
        return SetPropertyInternal<false>(instance, propertyId, index, value, ObjectSlotAttr_Default, info, flags, SideEffects_Any);
    }